

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::LoadFlagsFromFile(string *path)

{
  bool bVar1;
  FILE *__stream;
  ostream *poVar2;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *file;
  long lVar3;
  ulong uVar4;
  undefined1 local_58 [8];
  string contents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  
  __stream = fopen((path->_M_dataplus)._M_p,"r");
  file = extraout_RDX;
  if (__stream == (FILE *)0x0) {
    GTestLog::GTestLog((GTestLog *)local_58,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest.cc"
                       ,0x19cd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,FLAGS_gtest_flagfile_abi_cxx11_,DAT_002d8e90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    GTestLog::~GTestLog((GTestLog *)local_58);
    file = extraout_RDX_00;
  }
  ReadEntireFile_abi_cxx11_((string *)local_58,(internal *)__stream,file);
  fclose(__stream);
  contents.field_2._8_8_ = 0;
  SplitString((string *)local_58,'\n',
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&contents.field_2 + 8));
  if (contents.field_2._8_8_ != 0) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      if (*(long *)(contents.field_2._8_8_ + lVar3) != 0) {
        bVar1 = ParseGoogleTestFlag(*(char **)(contents.field_2._8_8_ + -8 + lVar3));
        if (!bVar1) {
          g_help_flag = 1;
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < (ulong)((long)-contents.field_2._8_8_ >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&contents.field_2 + 8));
  if (local_58 != (undefined1  [8])&contents._M_string_length) {
    operator_delete((void *)local_58,contents._M_string_length + 1);
  }
  return;
}

Assistant:

static void LoadFlagsFromFile(const std::string& path) {
  FILE* flagfile = posix::FOpen(path.c_str(), "r");
  if (!flagfile) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << GTEST_FLAG_GET(flagfile)
                      << "\"";
  }
  std::string contents(ReadEntireFile(flagfile));
  posix::FClose(flagfile);
  std::vector<std::string> lines;
  SplitString(contents, '\n', &lines);
  for (size_t i = 0; i < lines.size(); ++i) {
    if (lines[i].empty())
      continue;
    if (!ParseGoogleTestFlag(lines[i].c_str()))
      g_help_flag = true;
  }
}